

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
BasicBlock::InsertInstrBefore(BasicBlock *this,Instr *newInstr,Instr *beforeThisInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = Contains(this,beforeThisInstr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd98,"(this->Contains(beforeThisInstr))","this->Contains(beforeThisInstr)")
    ;
    if (!bVar2) goto LAB_003fddba;
    *puVar3 = 0;
  }
  IR::Instr::InsertBefore(beforeThisInstr,newInstr);
  if (this->firstInstr == beforeThisInstr) {
    if ((beforeThisInstr->m_kind == InstrKindProfiledLabel) ||
       (beforeThisInstr->m_kind == InstrKindLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xd9d,"(!beforeThisInstr->IsLabelInstr())",
                         "!beforeThisInstr->IsLabelInstr()");
      if (!bVar2) {
LAB_003fddba:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this->firstInstr = newInstr;
  }
  return;
}

Assistant:

void
BasicBlock::InsertInstrBefore(IR::Instr *newInstr, IR::Instr *beforeThisInstr)
{
    Assert(this->Contains(beforeThisInstr));
    beforeThisInstr->InsertBefore(newInstr);

    if(this->GetFirstInstr() == beforeThisInstr)
    {
        Assert(!beforeThisInstr->IsLabelInstr());
        this->SetFirstInstr(newInstr);
    }
}